

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.h
# Opt level: O2

MessageLite * __thiscall
google::protobuf::internal::MessageCreator::New<false,google::protobuf::MessageLite>
          (MessageCreator *this,MessageLite *prototype_for_func,MessageLite *prototype_for_copy,
          Arena *arena)

{
  void *mem;
  MessageLite *pMVar1;
  
  if (arena == (Arena *)0x0) {
    mem = operator_new((ulong)this->allocation_size_);
  }
  else {
    mem = Arena::AllocateAligned(arena,(ulong)this->allocation_size_,8);
  }
  pMVar1 = PlacementNew<false,google::protobuf::MessageLite>
                     (this,prototype_for_func,prototype_for_copy,mem,arena);
  return pMVar1;
}

Assistant:

PROTOBUF_ALWAYS_INLINE MessageLite* MessageCreator::New(
    const MessageLite* prototype_for_func,
    const MessageLite* prototype_for_copy, Arena* arena) const {
  return PlacementNew<test_call>(prototype_for_func, prototype_for_copy,
                                 arena != nullptr
                                     ? arena->AllocateAligned(allocation_size_)
                                     : ::operator new(allocation_size_),
                                 arena);
}